

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O2

void __thiscall
burst::
subset_iterator<const_char_*,_std::less<void>,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
::increment(subset_iterator<const_char_*,_std::less<void>,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
            *this)

{
  pointer ppcVar1;
  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_> _Var2;
  
  ppcVar1 = (this->m_subset).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  _Var2 = next_subset<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,char_const*,std::less<void>>
                    (ppcVar1,ppcVar1 + this->m_subset_size,this->m_begin,this->m_end);
  this->m_subset_size =
       (long)_Var2._M_current -
       (long)(this->m_subset).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  return;
}

Assistant:

void increment ()
        {
            const auto new_subset_end =
                next_subset(subset_begin(), subset_end(), m_begin, m_end, m_compare);
            m_subset_size = std::distance(subset_begin(), new_subset_end);
        }